

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

int PrecSetupBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,void *user_data)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  undefined8 in_RCX;
  int iVar9;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  double dVar10;
  UserData data;
  int jy;
  int jx;
  int j;
  int i;
  sunindextype ret;
  sunrealtype perturb_rates [6];
  sunrealtype *Pxycol;
  sunrealtype *ratesxy;
  sunrealtype **Pxy;
  sunrealtype *scxy;
  sunrealtype *cxy;
  sunrealtype fac;
  sunrealtype csave;
  sunrealtype dely;
  sunrealtype delx;
  sunrealtype yy;
  sunrealtype xx;
  sunrealtype sqruround;
  sunrealtype uround;
  sunrealtype r0;
  sunrealtype r;
  double local_100;
  int iVar11;
  int iVar12;
  int iVar13;
  int in_stack_ffffffffffffff1c;
  sunrealtype *in_stack_ffffffffffffff20;
  sunrealtype in_stack_ffffffffffffff28;
  sunrealtype in_stack_ffffffffffffff30;
  double local_40;
  
  dVar1 = *(double *)(in_R8 + 0x1d8);
  dVar2 = *(double *)(in_R8 + 0x1e0);
  dVar10 = (double)N_VWL2Norm(in_RDX,in_RCX);
  local_40 = dVar1 * 1000.0 * dVar10 * 150.0;
  if ((local_40 == 0.0) && (!NAN(local_40))) {
    local_40 = 1.0;
  }
  iVar11 = 0;
  do {
    if (4 < iVar11) {
      return 0;
    }
    for (iVar12 = 0; iVar12 < 5; iVar12 = iVar12 + 1) {
      lVar7 = *(long *)(in_R8 + (long)iVar12 * 0x28 + (long)iVar11 * 8);
      lVar5 = *(long *)(*in_RDI + 0x10) + (long)(iVar12 * 6 + iVar11 * 0x1e) * 8;
      lVar6 = *(long *)(*in_RSI + 0x10) + (long)(iVar12 * 6 + iVar11 * 0x1e) * 8;
      lVar3 = *(long *)(**(long **)(in_R8 + 0x1a0) + 0x10);
      iVar8 = iVar12 * 6;
      iVar9 = iVar11 * 0x1e;
      for (iVar13 = 0; iVar13 < 6; iVar13 = iVar13 + 1) {
        dVar1 = *(double *)(lVar5 + (long)iVar13 * 8);
        if (dVar2 * ABS(dVar1) <= local_40 / *(double *)(lVar6 + (long)iVar13 * 8)) {
          local_100 = local_40 / *(double *)(lVar6 + (long)iVar13 * 8);
        }
        else {
          local_100 = dVar2 * ABS(dVar1);
        }
        *(double *)(lVar5 + (long)iVar13 * 8) = local_100 + *(double *)(lVar5 + (long)iVar13 * 8);
        WebRate(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                (sunrealtype *)CONCAT44(in_stack_ffffffffffffff1c,iVar13),
                (void *)CONCAT44(iVar12,iVar11));
        *(double *)(lVar5 + (long)iVar13 * 8) = dVar1;
        lVar4 = *(long *)(lVar7 + (long)iVar13 * 8);
        for (in_stack_ffffffffffffff1c = 0; in_stack_ffffffffffffff1c < 6;
            in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c + 1) {
          *(double *)(lVar4 + (long)in_stack_ffffffffffffff1c * 8) =
               (*(double *)(&stack0xffffffffffffff28 + (long)in_stack_ffffffffffffff1c * 8) -
               *(double *)(lVar3 + (long)(iVar8 + iVar9) * 8 + (long)in_stack_ffffffffffffff1c * 8))
               * (1.0 / local_100);
        }
      }
      lVar7 = SUNDlsMat_denseGETRF
                        (lVar7,6,6,
                         *(undefined8 *)(in_R8 + 200 + (long)iVar12 * 0x28 + (long)iVar11 * 8));
      if (lVar7 != 0) {
        return 1;
      }
      in_stack_ffffffffffffff20 = (sunrealtype *)0x0;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

static int PrecSetupBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, void* user_data)
{
  sunrealtype r, r0, uround, sqruround, xx, yy, delx, dely, csave, fac;
  sunrealtype *cxy, *scxy, **Pxy, *ratesxy, *Pxycol, perturb_rates[NUM_SPECIES];
  sunindextype ret;
  int i, j, jx, jy;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  uround    = data->uround;
  sqruround = data->sqruround;
  fac       = N_VWL2Norm(fval, fscale);
  r0        = THOUSAND * uround * fac * NEQ;
  if (r0 == ZERO) { r0 = ONE; }

  /* Loop over spatial points; get size NUM_SPECIES Jacobian block at each */
  for (jy = 0; jy < MY; jy++)
  {
    yy = jy * dely;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = jx * delx;
      Pxy     = (data->P)[jx][jy];
      cxy     = IJ_Vptr(cc, jx, jy);
      scxy    = IJ_Vptr(cscale, jx, jy);
      ratesxy = IJ_Vptr((data->rates), jx, jy);

      /* Compute difference quotients of interaction rate fn. */
      for (j = 0; j < NUM_SPECIES; j++)
      {
        csave = cxy[j]; /* Save the j,jx,jy element of cc */
        r     = MAX(sqruround * SUNRabs(csave), r0 / scxy[j]);
        cxy[j] += r; /* Perturb the j,jx,jy element of cc */
        fac = ONE / r;

        WebRate(xx, yy, cxy, perturb_rates, data);

        /* Restore j,jx,jy element of cc */
        cxy[j] = csave;

        /* Load the j-th column of difference quotients */
        Pxycol = Pxy[j];
        for (i = 0; i < NUM_SPECIES; i++)
        {
          Pxycol[i] = (perturb_rates[i] - ratesxy[i]) * fac;
        }

      } /* end of j loop */

      /* Do LU decomposition of size NUM_SPECIES preconditioner block */
      ret = SUNDlsMat_denseGETRF(Pxy, NUM_SPECIES, NUM_SPECIES,
                                 (data->pivot)[jx][jy]);
      if (ret != 0) { return (1); }

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}